

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O3

void __thiscall Response::decode_url(Response *this,iterator dst,char *src)

{
  char cVar1;
  int iVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  
  do {
    cVar3 = *src;
    if (cVar3 == '%') {
      cVar1 = src[1];
      if (cVar1 != '\0') {
        cVar5 = src[2];
        if (cVar5 != '\0') {
          iVar2 = isxdigit((int)cVar1);
          if (iVar2 != 0) {
            iVar2 = isxdigit((int)cVar5);
            if (iVar2 != 0) {
              cVar3 = cVar1 + -0x20;
              if (cVar1 < 'a') {
                cVar3 = cVar1;
              }
              cVar1 = '\t';
              if (cVar3 < 'A') {
                cVar1 = '\0';
              }
              cVar4 = cVar5 + -0x20;
              if (cVar5 < 'a') {
                cVar4 = cVar5;
              }
              cVar5 = -0x37;
              if (cVar4 < 'A') {
                cVar5 = -0x30;
              }
              *dst._M_current = cVar4 + cVar5 + (cVar1 + cVar3) * '\x10';
              src = src + 3;
              goto LAB_0010858d;
            }
          }
        }
      }
LAB_00108587:
      src = src + 1;
      *dst._M_current = cVar3;
    }
    else {
      if (cVar3 != '+') {
        if (cVar3 == '\0') {
          *dst._M_current = '\0';
          return;
        }
        goto LAB_00108587;
      }
      *dst._M_current = ' ';
      src = src + 1;
    }
LAB_0010858d:
    dst._M_current = dst._M_current + 1;
  } while( true );
}

Assistant:

void Response::decode_url(std::string::iterator dst, const char *src) const {
    char a, b;
    while (*src) {
        if ((*src == '%') &&
            ((a = src[1]) && (b = src[2])) &&
            (isxdigit(a) && isxdigit(b))) {
                if (a >= 'a')
                        a -= 'a'-'A';
                if (a >= 'A')
                        a -= ('A' - 10);
                else
                        a -= '0';
                if (b >= 'a')
                        b -= 'a'-'A';
                if (b >= 'A')
                        b -= ('A' - 10);
                else
                        b -= '0';
                *dst++ = 16*a+b;
                src+=3;
        } else if (*src == '+') {
                *dst++ = ' ';
                src++;
        } else {
                *dst++ = *src++;
        }
    }
    *dst++ = '\0';
}